

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O2

void __thiscall miniros::RPCManager::~RPCManager(RPCManager *this)

{
  int in_EDX;
  int in_ESI;
  
  shutdown(this,in_ESI,in_EDX);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::RPCManager::FunctionInfo>_>_>
  ::~_Rb_tree(&(this->functions_)._M_t);
  std::
  _Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  ::~_Rb_tree(&(this->connections_)._M_t);
  std::
  _Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  ::~_Rb_tree(&(this->removed_connections_)._M_t);
  std::
  _Rb_tree<std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::shared_ptr<miniros::ASyncXMLRPCConnection>,_std::_Identity<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::less<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>,_std::allocator<std::shared_ptr<miniros::ASyncXMLRPCConnection>_>_>
  ::~_Rb_tree(&(this->added_connections_)._M_t);
  std::_Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>::
  ~_Vector_base(&(this->clients_).
                 super__Vector_base<miniros::CachedXmlRpcClient,_std::allocator<miniros::CachedXmlRpcClient>_>
               );
  XmlRpc::XmlRpcServer::~XmlRpcServer(&this->server_);
  std::thread::~thread(&this->server_thread_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

RPCManager::~RPCManager()
{
  shutdown();
}